

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,Reader *params,char (*params_1) [4],
          StringTree *params_2)

{
  ArrayPtr<const_char> local_38;
  size_t local_28;
  char *local_20;
  
  local_28 = *(size_t *)this;
  local_20 = (char *)(*(long *)(this + 8) + -1);
  local_38 = toCharSequence<char_const(&)[4]>((char (*) [4])params);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,(StringTree *)&stack0xffffffffffffffd8,&local_38,
             (ArrayPtr<const_char> *)params_1,params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}